

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

Tree * new_tree(List *list)

{
  Token *pTVar1;
  void *any;
  Tree *pTVar2;
  TreeNode *pTVar3;
  
  any = malloc(0x18);
  pTVar2 = (Tree *)require_not_null(any,"Failed to allocate space");
  pTVar3 = new_tree_node((Token *)0x0,tree_eval);
  pTVar1 = pTVar3->token;
  (pTVar2->node).eval = pTVar3->eval;
  (pTVar2->node).token = pTVar1;
  pTVar2->stmts = list;
  return pTVar2;
}

Assistant:

Tree *new_tree(List *list) {
    Tree *tree = new(Tree);
    tree->node = tree_node_(NULL,eval_handler(tree_eval));
    tree->stmts = list;
    return tree;
}